

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

WhereTerm *
whereScanInit(WhereScan *pScan,WhereClause *pWC,int iCur,int iColumn,u32 opMask,Index *pIdx)

{
  WhereTerm *pWVar1;
  short sVar2;
  
  sVar2 = (short)iColumn;
  pScan->pOrigWC = pWC;
  pScan->pWC = pWC;
  pScan->zCollName = (char *)0x0;
  pScan->pIdxExpr = (Expr *)0x0;
  pScan->idxaff = '\0';
  pScan->opMask = opMask;
  pScan->k = 0;
  pScan->aiCur[0] = iCur;
  pScan->nEquiv = '\x01';
  pScan->iEquiv = '\x01';
  if (pIdx == (Index *)0x0) {
    if (iColumn == -2) {
      return (WhereTerm *)0x0;
    }
  }
  else {
    sVar2 = pIdx->aiColumn[iColumn];
    if ((int)sVar2 == 0xfffffffe) {
      pScan->pIdxExpr = pIdx->aColExpr->a[iColumn].pExpr;
      pScan->zCollName = pIdx->azColl[iColumn];
      pScan->aiColumn[0] = -2;
      pWVar1 = whereScanInitIndexExpr(pScan);
      return pWVar1;
    }
    if (sVar2 == pIdx->pTable->iPKey) {
      sVar2 = -1;
    }
    else if (-1 < sVar2) {
      pScan->idxaff = pIdx->pTable->aCol[(uint)(int)sVar2].affinity;
      pScan->zCollName = pIdx->azColl[iColumn];
    }
  }
  pScan->aiColumn[0] = sVar2;
  pWVar1 = whereScanNext(pScan);
  return pWVar1;
}

Assistant:

static WhereTerm *whereScanInit(
  WhereScan *pScan,       /* The WhereScan object being initialized */
  WhereClause *pWC,       /* The WHERE clause to be scanned */
  int iCur,               /* Cursor to scan for */
  int iColumn,            /* Column to scan for */
  u32 opMask,             /* Operator(s) to scan for */
  Index *pIdx             /* Must be compatible with this index */
){
  pScan->pOrigWC = pWC;
  pScan->pWC = pWC;
  pScan->pIdxExpr = 0;
  pScan->idxaff = 0;
  pScan->zCollName = 0;
  pScan->opMask = opMask;
  pScan->k = 0;
  pScan->aiCur[0] = iCur;
  pScan->nEquiv = 1;
  pScan->iEquiv = 1;
  if( pIdx ){
    int j = iColumn;
    iColumn = pIdx->aiColumn[j];
    if( iColumn==XN_EXPR ){
      pScan->pIdxExpr = pIdx->aColExpr->a[j].pExpr;
      pScan->zCollName = pIdx->azColl[j];
      pScan->aiColumn[0] = XN_EXPR;
      return whereScanInitIndexExpr(pScan);
    }else if( iColumn==pIdx->pTable->iPKey ){
      iColumn = XN_ROWID;
    }else if( iColumn>=0 ){
      pScan->idxaff = pIdx->pTable->aCol[iColumn].affinity;
      pScan->zCollName = pIdx->azColl[j];
    }
  }else if( iColumn==XN_EXPR ){
    return 0;
  }
  pScan->aiColumn[0] = iColumn;
  return whereScanNext(pScan);
}